

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tankmixmodel.cpp
# Opt level: O1

void __thiscall TankMixModel::TankMixModel(TankMixModel *this)

{
  this->type = 0;
  this->cTol = 0.0;
  this->fracMixed = 0.0;
  this->cTank = 0.0;
  this->vMixed = 0.0;
  this->firstSeg = (Segment *)0x0;
  this->lastSeg = (Segment *)0x0;
  return;
}

Assistant:

TankMixModel::TankMixModel() :
    type(MIX1),
    cTol(0.0),
    fracMixed(0.0),
    cTank(0.0),
    vMixed(0.0),
    firstSeg(nullptr),
    lastSeg(nullptr)
{ }